

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O0

void __thiscall
Diligent::DescriptorPoolManager::FreePool(DescriptorPoolManager *this,DescriptorPoolWrapper *Pool)

{
  VulkanLogicalDevice *this_00;
  VkDescriptorPool_T *vkDescriptorPool;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> Lock;
  DescriptorPoolWrapper *Pool_local;
  DescriptorPoolManager *this_local;
  
  Lock._M_device = (mutex_type *)Pool;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->m_Mutex);
  this_00 = RenderDeviceVkImpl::GetLogicalDevice(this->m_DeviceVkImpl);
  vkDescriptorPool =
       VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkDescriptorPool_T_
                 ((VulkanObjectWrapper *)Lock._M_device);
  VulkanUtilities::VulkanLogicalDevice::ResetDescriptorPool(this_00,vkDescriptorPool,0);
  std::
  deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>>
  ::
  emplace_back<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>
            ((deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>>
              *)&this->m_Pools,
             (VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14> *)
             Lock._M_device);
  std::__atomic_base<int>::operator--(&(this->m_AllocatedPoolCounter).super___atomic_base<int>);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void DescriptorPoolManager::FreePool(VulkanUtilities::DescriptorPoolWrapper&& Pool)
{
    std::lock_guard<std::mutex> Lock{m_Mutex};
    m_DeviceVkImpl.GetLogicalDevice().ResetDescriptorPool(Pool);
    m_Pools.emplace_back(std::move(Pool));
#ifdef DILIGENT_DEVELOPMENT
    --m_AllocatedPoolCounter;
#endif
}